

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O2

void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  bool bVar63;
  
  uVar54 = *arg1;
  uVar46 = arg2[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar46;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar54;
  uVar48 = SUB168(auVar2 * auVar22,8);
  uVar41 = SUB168(auVar2 * auVar22,0);
  uVar45 = *arg2;
  uVar55 = arg2[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar55;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar54;
  uVar49 = SUB168(auVar3 * auVar23,8);
  uVar42 = SUB168(auVar3 * auVar23,0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar45;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar54;
  uVar50 = SUB168(auVar4 * auVar24,8);
  uVar43 = SUB168(auVar4 * auVar24,0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar43 * -0x429985475ccb87a9;
  uVar51 = SUB168(auVar5 * ZEXT816(0xc99),8);
  uVar1 = uVar50 + uVar42;
  uVar56 = (ulong)CARRY8(SUB168(auVar5 * ZEXT816(0xc99),0),uVar43);
  uVar52 = uVar51 + uVar1;
  bVar63 = CARRY8(uVar51,uVar1) || CARRY8(uVar52,uVar56);
  uVar52 = uVar52 + uVar56;
  uVar42 = (ulong)CARRY8(uVar50,uVar42);
  uVar50 = uVar49 + uVar41;
  uVar60 = uVar50 + uVar42;
  uVar1 = arg1[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar55;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar1;
  uVar53 = SUB168(auVar6 * auVar25,8);
  uVar51 = SUB168(auVar6 * auVar25,0);
  auVar38._8_8_ = uVar51;
  auVar38._0_8_ = uVar52;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar45;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar1;
  auVar7 = auVar7 * auVar26;
  uVar47 = SUB168(auVar7 + auVar38,0);
  uVar56 = arg2[3];
  uVar58 = SUB168(auVar7 + auVar38,8) + uVar60 + (ulong)bVar63;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar56;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar54;
  uVar44 = SUB168(auVar8 * auVar27,0);
  uVar54 = (ulong)(CARRY8(uVar49,uVar41) || CARRY8(uVar50,uVar42));
  uVar42 = uVar44 + uVar48;
  uVar61 = uVar42 + uVar54;
  uVar48 = SUB168(auVar8 * auVar27,8) + (ulong)(CARRY8(uVar44,uVar48) || CARRY8(uVar42,uVar54));
  uVar49 = uVar43 * -0x429985475ccb87a9 >> 1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar56;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar1;
  uVar50 = SUB168(auVar9 * auVar28,0);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar46;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar1;
  uVar44 = SUB168(auVar10 * auVar29,8);
  uVar41 = SUB168(auVar10 * auVar29,0);
  uVar1 = auVar7._8_8_ + uVar51;
  uVar54 = (ulong)CARRY8(auVar7._8_8_,uVar51);
  uVar42 = uVar41 + uVar53;
  uVar59 = uVar42 + uVar54;
  uVar54 = (ulong)(CARRY8(uVar41,uVar53) || CARRY8(uVar42,uVar54));
  uVar42 = uVar44 + uVar50;
  uVar53 = uVar42 + uVar54;
  uVar57 = SUB168(auVar9 * auVar28,8) + (ulong)(CARRY8(uVar44,uVar50) || CARRY8(uVar42,uVar54));
  uVar54 = (ulong)bVar63;
  uVar44 = uVar60 + uVar54;
  uVar54 = (ulong)CARRY8(uVar60,uVar54);
  uVar42 = (uVar43 << 0x3f) + uVar61;
  uVar51 = uVar42 + uVar54;
  uVar54 = (ulong)(CARRY8(uVar43 << 0x3f,uVar61) || CARRY8(uVar42,uVar54));
  uVar42 = uVar49 + uVar48;
  uVar43 = uVar42 + uVar54;
  uVar54 = (ulong)(CARRY8(uVar49,uVar48) || CARRY8(uVar42,uVar54));
  uVar60 = uVar57 + uVar54;
  uVar49 = uVar47 * -0x429985475ccb87a9;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar49;
  uVar41 = SUB168(auVar11 * ZEXT816(0xc99),8);
  uVar42 = (ulong)CARRY8(SUB168(auVar11 * ZEXT816(0xc99),0),uVar47);
  uVar50 = uVar41 + uVar58;
  bVar63 = CARRY8(uVar41,uVar58) || CARRY8(uVar50,uVar42);
  uVar50 = uVar50 + uVar42;
  uVar1 = (ulong)(CARRY8(uVar44,uVar1) || CARRY8(uVar44 + uVar1,(ulong)CARRY8(uVar52,auVar7._0_8_)))
  ;
  uVar42 = uVar51 + uVar59;
  uVar41 = uVar42 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar51,uVar59) || CARRY8(uVar42,uVar1));
  uVar42 = uVar43 + uVar53;
  uVar61 = uVar42 + uVar1;
  uVar42 = (ulong)(CARRY8(uVar43,uVar53) || CARRY8(uVar42,uVar1));
  uVar58 = uVar60 + uVar42;
  uVar1 = arg1[2];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar55;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar1;
  uVar47 = SUB168(auVar12 * auVar30,8);
  uVar43 = SUB168(auVar12 * auVar30,0);
  auVar39._8_8_ = uVar43;
  auVar39._0_8_ = uVar50;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar45;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar1;
  auVar13 = auVar13 * auVar31;
  uVar62 = SUB168(auVar13 + auVar39,0);
  uVar59 = SUB168(auVar13 + auVar39,8) + uVar41 + (ulong)bVar63;
  uVar51 = uVar52 + auVar7._0_8_ << 0x3f;
  uVar49 = uVar49 >> 1;
  uVar52 = (ulong)bVar63;
  uVar48 = uVar41 + uVar52;
  uVar52 = (ulong)CARRY8(uVar41,uVar52);
  uVar41 = uVar51 + uVar61;
  uVar44 = uVar41 + uVar52;
  uVar52 = (ulong)(CARRY8(uVar51,uVar61) || CARRY8(uVar41,uVar52));
  uVar41 = uVar49 + uVar58;
  uVar53 = uVar41 + uVar52;
  uVar51 = (ulong)(CARRY8(uVar49,uVar58) || CARRY8(uVar41,uVar52)) + (ulong)CARRY8(uVar57,uVar54) +
           (ulong)CARRY8(uVar60,uVar42);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar56;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar1;
  uVar42 = SUB168(auVar14 * auVar32,0);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar46;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar1;
  uVar41 = SUB168(auVar15 * auVar33,8);
  uVar52 = SUB168(auVar15 * auVar33,0);
  uVar57 = auVar13._8_8_ + uVar43;
  uVar1 = (ulong)CARRY8(auVar13._8_8_,uVar43);
  uVar54 = uVar52 + uVar47;
  uVar60 = uVar54 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar52,uVar47) || CARRY8(uVar54,uVar1));
  uVar54 = uVar41 + uVar42;
  uVar43 = uVar54 + uVar1;
  uVar47 = SUB168(auVar14 * auVar32,8) + (ulong)(CARRY8(uVar41,uVar42) || CARRY8(uVar54,uVar1));
  uVar49 = uVar62 * -0x429985475ccb87a9;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar49;
  uVar54 = SUB168(auVar16 * ZEXT816(0xc99),8);
  uVar1 = (ulong)CARRY8(SUB168(auVar16 * ZEXT816(0xc99),0),uVar62);
  uVar42 = uVar54 + uVar59;
  bVar63 = CARRY8(uVar54,uVar59) || CARRY8(uVar42,uVar1);
  uVar42 = uVar42 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar57,uVar48) ||
                 CARRY8(uVar57 + uVar48,(ulong)CARRY8(uVar50,auVar13._0_8_)));
  uVar54 = uVar60 + uVar44;
  uVar58 = uVar54 + uVar1;
  uVar54 = (ulong)(CARRY8(uVar60,uVar44) || CARRY8(uVar54,uVar1));
  uVar52 = uVar43 + uVar53;
  uVar57 = uVar52 + uVar54;
  uVar1 = arg1[3];
  uVar54 = (ulong)(CARRY8(uVar43,uVar53) || CARRY8(uVar52,uVar54));
  uVar52 = uVar47 + uVar51;
  uVar48 = uVar52 + uVar54;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar55;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar1;
  uVar43 = SUB168(auVar17 * auVar34,8);
  uVar41 = SUB168(auVar17 * auVar34,0);
  auVar40._8_8_ = uVar41;
  auVar40._0_8_ = uVar42;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar45;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar1;
  auVar18 = auVar18 * auVar35;
  uVar44 = SUB168(auVar18 + auVar40,8) + uVar58 + (ulong)bVar63;
  uVar53 = uVar50 + auVar13._0_8_ << 0x3f;
  uVar49 = uVar49 >> 1;
  uVar45 = (ulong)bVar63;
  uVar50 = uVar58 + uVar45;
  uVar45 = (ulong)CARRY8(uVar58,uVar45);
  uVar55 = uVar53 + uVar57;
  uVar60 = uVar55 + uVar45;
  uVar45 = (ulong)(CARRY8(uVar53,uVar57) || CARRY8(uVar55,uVar45));
  uVar55 = uVar49 + uVar48;
  uVar53 = uVar55 + uVar45;
  uVar48 = (ulong)(CARRY8(uVar49,uVar48) || CARRY8(uVar55,uVar45)) +
           (ulong)(CARRY8(uVar47,uVar51) || CARRY8(uVar52,uVar54));
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar56;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar1;
  uVar45 = SUB168(auVar19 * auVar36,0);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar46;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar1;
  uVar55 = SUB168(auVar20 * auVar37,8);
  uVar46 = SUB168(auVar20 * auVar37,0);
  uVar52 = auVar18._8_8_ + uVar41;
  uVar1 = (ulong)CARRY8(auVar18._8_8_,uVar41);
  uVar54 = uVar46 + uVar43;
  uVar56 = uVar54 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar46,uVar43) || CARRY8(uVar54,uVar1));
  uVar54 = uVar55 + uVar45;
  uVar46 = uVar54 + uVar1;
  uVar55 = SUB168(auVar19 * auVar36,8) + (ulong)(CARRY8(uVar55,uVar45) || CARRY8(uVar54,uVar1));
  uVar47 = SUB168(auVar18 + auVar40,0);
  uVar1 = (ulong)(CARRY8(uVar52,uVar50) ||
                 CARRY8(uVar52 + uVar50,(ulong)CARRY8(uVar42,auVar18._0_8_)));
  uVar54 = uVar56 + uVar60;
  uVar50 = uVar54 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar56,uVar60) || CARRY8(uVar54,uVar1));
  uVar54 = uVar46 + uVar53;
  uVar51 = uVar54 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar46,uVar53) || CARRY8(uVar54,uVar1));
  uVar46 = uVar55 + uVar48;
  uVar56 = uVar46 + uVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar47 * -0x429985475ccb87a9;
  uVar42 = SUB168(auVar21 * ZEXT816(0xc99),8);
  uVar43 = uVar47 * -0x429985475ccb87a9 >> 1;
  uVar54 = (ulong)CARRY8(SUB168(auVar21 * ZEXT816(0xc99),0),uVar47);
  uVar45 = uVar42 + uVar44;
  uVar52 = uVar45 + uVar54;
  uVar54 = (ulong)(CARRY8(uVar42,uVar44) || CARRY8(uVar45,uVar54));
  uVar41 = uVar50 + uVar54;
  uVar54 = (ulong)CARRY8(uVar50,uVar54);
  uVar45 = (uVar47 << 0x3f) + uVar51;
  uVar50 = uVar45 + uVar54;
  uVar54 = (ulong)(CARRY8(uVar47 << 0x3f,uVar51) || CARRY8(uVar45,uVar54));
  uVar45 = uVar43 + uVar56;
  uVar51 = uVar45 + uVar54;
  uVar44 = (ulong)(byte)-((0xc98 < uVar52) + -1);
  uVar42 = (ulong)(uVar41 < uVar44);
  uVar47 = (ulong)(uVar50 < uVar42) | 0x8000000000000000;
  uVar1 = -(ulong)((byte)((CARRY8(uVar43,uVar56) || CARRY8(uVar45,uVar54)) +
                         (CARRY8(uVar55,uVar48) || CARRY8(uVar46,uVar1))) < (uVar51 < uVar47));
  uVar54 = ~uVar1;
  *out1 = uVar52 - 0xc99 & uVar54 | uVar52 & uVar1;
  out1[1] = uVar41 - uVar44 & uVar54 | uVar41 & uVar1;
  out1[2] = uVar50 - uVar42 & uVar54 | uVar50 & uVar1;
  out1[3] = uVar54 & uVar51 - uVar47 | uVar1 & uVar51;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(
    uint64_t out1[4], const uint64_t arg1[4], const uint64_t arg2[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x14;
    uint64_t x15;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x16;
    uint64_t x17;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x27;
    uint64_t x28;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x29;
    uint64_t x30;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x31;
    uint64_t x32;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x33;
    uint64_t x34;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    uint64_t x43;
    uint64_t x44;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x45;
    uint64_t x46;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x47;
    uint64_t x48;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x49;
    uint64_t x50;
    uint64_t x51;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x52;
    uint64_t x53;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x54;
    uint64_t x55;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x56;
    uint64_t x57;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x58;
    uint64_t x59;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x60;
    uint64_t x61;
    uint64_t x62;
    uint64_t x63;
    uint64_t x64;
    uint64_t x65;
    uint64_t x66;
    uint64_t x67;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x68;
    uint64_t x69;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x70;
    uint64_t x71;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x72;
    uint64_t x73;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x74;
    uint64_t x75;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x76;
    uint64_t x77;
    uint64_t x78;
    uint64_t x79;
    uint64_t x80;
    uint64_t x81;
    uint64_t x82;
    uint64_t x83;
    uint64_t x84;
    uint64_t x85;
    uint64_t x86;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x87;
    uint64_t x88;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x89;
    uint64_t x90;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x91;
    uint64_t x92;
    uint64_t x93;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x94;
    uint64_t x95;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x96;
    uint64_t x97;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x98;
    uint64_t x99;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x100;
    uint64_t x101;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x102;
    uint64_t x103;
    uint64_t x104;
    uint64_t x105;
    uint64_t x106;
    uint64_t x107;
    uint64_t x108;
    uint64_t x109;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x110;
    uint64_t x111;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x112;
    uint64_t x113;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x114;
    uint64_t x115;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x116;
    uint64_t x117;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x118;
    uint64_t x119;
    uint64_t x120;
    uint64_t x121;
    uint64_t x122;
    uint64_t x123;
    uint64_t x124;
    uint64_t x125;
    uint64_t x126;
    uint64_t x127;
    uint64_t x128;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x129;
    uint64_t x130;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x131;
    uint64_t x132;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x133;
    uint64_t x134;
    uint64_t x135;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x136;
    uint64_t x137;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x138;
    uint64_t x139;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x140;
    uint64_t x141;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x142;
    uint64_t x143;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x144;
    uint64_t x145;
    uint64_t x146;
    uint64_t x147;
    uint64_t x148;
    uint64_t x149;
    uint64_t x150;
    uint64_t x151;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x152;
    uint64_t x153;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x154;
    uint64_t x155;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x156;
    uint64_t x157;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x158;
    uint64_t x159;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x160;
    uint64_t x161;
    uint64_t x162;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x163;
    uint64_t x164;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x165;
    uint64_t x166;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x167;
    uint64_t x168;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x169;
    uint64_t x170;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x171;
    uint64_t x172;
    uint64_t x173;
    uint64_t x174;
    uint64_t x175;
    x1 = (arg1[1]);
    x2 = (arg1[2]);
    x3 = (arg1[3]);
    x4 = (arg1[0]);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x5, &x6, x4,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x7, &x8, x4,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x9, &x10, x4,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x11, &x12, x4,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x13, &x14, 0x0,
                                                              x12, x9);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x15, &x16, x14,
                                                              x10, x7);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x17, &x18, x16,
                                                              x8, x5);
    x19 = (x18 + x6);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x20, &x21, x11, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x22, &x23, x20, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x24, &x25, x20,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x26, &x27, 0x0,
                                                              x11, x24);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x28, &x29, x27,
                                                              x13, x25);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x30, &x31, x29,
                                                              x15, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x32, &x33, x31,
                                                              x17, x22);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x34, &x35, x33,
                                                              x19, x23);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x36, &x37, x1,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x38, &x39, x1,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x40, &x41, x1,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x42, &x43, x1,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x44, &x45, 0x0,
                                                              x43, x40);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x46, &x47, x45,
                                                              x41, x38);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x48, &x49, x47,
                                                              x39, x36);
    x50 = (x49 + x37);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x51, &x52, 0x0,
                                                              x28, x42);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x53, &x54, x52,
                                                              x30, x44);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x55, &x56, x54,
                                                              x32, x46);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x57, &x58, x56,
                                                              x34, x48);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x59, &x60, x58,
                                                              x35, x50);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x61, &x62, x51, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x63, &x64, x61, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x65, &x66, x61,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x67, &x68, 0x0,
                                                              x51, x65);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x69, &x70, x68,
                                                              x53, x66);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x71, &x72, x70,
                                                              x55, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x73, &x74, x72,
                                                              x57, x63);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x75, &x76, x74,
                                                              x59, x64);
    x77 = ((uint64_t)x76 + x60);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x78, &x79, x2,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x80, &x81, x2,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x82, &x83, x2,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x84, &x85, x2,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x86, &x87, 0x0,
                                                              x85, x82);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x88, &x89, x87,
                                                              x83, x80);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x90, &x91, x89,
                                                              x81, x78);
    x92 = (x91 + x79);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x93, &x94, 0x0,
                                                              x69, x84);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x95, &x96, x94,
                                                              x71, x86);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x97, &x98, x96,
                                                              x73, x88);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x99, &x100, x98,
                                                              x75, x90);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x101, &x102,
                                                              x100, x77, x92);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x103, &x104, x93, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x105, &x106, x103, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x107, &x108, x103,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x109, &x110, 0x0,
                                                              x93, x107);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x111, &x112,
                                                              x110, x95, x108);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x113, &x114,
                                                              x112, x97, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x115, &x116,
                                                              x114, x99, x105);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x117, &x118,
                                                              x116, x101, x106);
    x119 = ((uint64_t)x118 + x102);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x120, &x121, x3,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x122, &x123, x3,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x124, &x125, x3,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x126, &x127, x3,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x128, &x129, 0x0,
                                                              x127, x124);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x130, &x131,
                                                              x129, x125, x122);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x132, &x133,
                                                              x131, x123, x120);
    x134 = (x133 + x121);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x135, &x136, 0x0,
                                                              x111, x126);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x137, &x138,
                                                              x136, x113, x128);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x139, &x140,
                                                              x138, x115, x130);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x141, &x142,
                                                              x140, x117, x132);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x143, &x144,
                                                              x142, x119, x134);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x145, &x146, x135, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x147, &x148, x145, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x149, &x150, x145,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x151, &x152, 0x0,
                                                              x135, x149);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x153, &x154,
                                                              x152, x137, x150);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x155, &x156,
                                                              x154, x139, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x157, &x158,
                                                              x156, x141, x147);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x159, &x160,
                                                              x158, x143, x148);
    x161 = ((uint64_t)x160 + x144);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(
        &x162, &x163, 0x0, x153, UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(&x164, &x165,
                                                               x163, x155, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(&x166, &x167,
                                                               x165, x157, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(
        &x168, &x169, x167, x159, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(&x170, &x171,
                                                               x169, x161, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x172, x171, x162,
                                                            x153);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x173, x171, x164,
                                                            x155);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x174, x171, x166,
                                                            x157);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x175, x171, x168,
                                                            x159);
    out1[0] = x172;
    out1[1] = x173;
    out1[2] = x174;
    out1[3] = x175;
}